

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O0

color_quad_u8 __thiscall
crnlib::dxt1_block::unpack_color(dxt1_block *this,uint16 packed_color,bool scaled,uint alpha)

{
  uint alpha_00;
  undefined4 local_24;
  undefined4 local_20;
  uint r;
  uint g;
  uint b;
  uint alpha_local;
  bool scaled_local;
  uint16 packed_color_local;
  
  r = packed_color & 0x1f;
  local_20 = (int)(uint)packed_color >> 5 & 0x3f;
  local_24 = (int)(uint)packed_color >> 0xb;
  if (scaled) {
    r = r << 3 | r >> 2;
    local_20 = local_20 << 2 | local_20 >> 4;
    local_24 = local_24 << 3 | local_24 >> 2;
  }
  alpha_00 = math::minimum<unsigned_int>(alpha,0xff);
  color_quad<unsigned_char,_int>::color_quad
            ((color_quad<unsigned_char,_int> *)this,cNoClamp,local_24,local_20,r,alpha_00);
  return (color_quad_u8)SUB84(this,0);
}

Assistant:

color_quad_u8 dxt1_block::unpack_color(uint16 packed_color, bool scaled, uint alpha)
    {
        uint b = packed_color & 31U;
        uint g = (packed_color >> 5U) & 63U;
        uint r = (packed_color >> 11U) & 31U;

        if (scaled)
        {
            b = (b << 3U) | (b >> 2U);
            g = (g << 2U) | (g >> 4U);
            r = (r << 3U) | (r >> 2U);
        }

        return color_quad_u8(cNoClamp, r, g, b, math::minimum(alpha, 255U));
    }